

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

void secp256k1_ellswift_elligatorswift_var
               (uchar *u32,secp256k1_fe *t,secp256k1_ge *p,secp256k1_sha256 *hasher)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint32_t cnt;
  uint32_t cnt_00;
  uchar branch_hash [32];
  secp256k1_fe u;
  
  cnt = 0;
  uVar4 = 0;
  do {
    uVar2 = uVar4;
    cnt_00 = cnt;
    if (uVar4 == 0) {
      cnt_00 = cnt + 1;
      secp256k1_ellswift_prng(branch_hash,hasher,cnt);
      uVar2 = 0x40;
    }
    uVar4 = uVar2 - 1;
    bVar1 = branch_hash[uVar4 >> 1];
    cnt = cnt_00 + 1;
    secp256k1_ellswift_prng(u32,hasher,cnt_00);
    secp256k1_fe_impl_set_b32_mod(&u,u32);
    iVar3 = secp256k1_ellswift_xswiftec_inv_var
                      (t,&p->x,&u,bVar1 >> ((char)uVar2 * '\x04' - 4U & 4) & 7);
  } while (iVar3 == 0);
  secp256k1_fe_impl_normalize_var(t);
  if ((((uint)(p->y).n[0] ^ (uint)t->n[0]) & 1) == 0) {
    return;
  }
  secp256k1_fe_impl_negate_unchecked(t,t,1);
  secp256k1_fe_impl_normalize_var(t);
  return;
}

Assistant:

static void secp256k1_ellswift_elligatorswift_var(unsigned char *u32, secp256k1_fe *t, const secp256k1_ge *p, const secp256k1_sha256 *hasher) {
    secp256k1_ellswift_xelligatorswift_var(u32, t, &p->x, hasher);
    secp256k1_fe_normalize_var(t);
    if (secp256k1_fe_is_odd(t) != secp256k1_fe_is_odd(&p->y)) {
        secp256k1_fe_negate(t, t, 1);
        secp256k1_fe_normalize_var(t);
    }
}